

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

void __thiscall GoState<9U,_9U>::check_alive(GoState<9U,_9U> *this,int i,int j)

{
  byte bVar1;
  bool bVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  _Rb_tree_const_iterator<std::pair<int,_int>_> *in_RDI;
  int j_1;
  int i_1;
  pair<int,_int> *ij;
  iterator __end3;
  iterator __begin3;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *__range3;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  pieces;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_stack_ffffffffffffff58;
  pair<int,_int> *__in;
  undefined7 in_stack_ffffffffffffff70;
  int local_78;
  int local_74;
  _Self local_68;
  _Self local_60;
  pair<int,_int> *local_58;
  pair<int,_int> local_40 [6];
  undefined4 local_10;
  undefined4 local_c;
  
  __in = local_40;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)0x1b67a9);
  bVar1 = (*(code *)in_RDI->_M_node[2]._M_parent)(in_RDI,local_c,local_10,__in);
  if ((bVar1 & 1) == 0) {
    local_58 = local_40;
    local_60._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::begin(in_stack_ffffffffffffff58);
    local_68._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::end(in_stack_ffffffffffffff58);
    while (bVar2 = std::operator!=(&local_60,&local_68), bVar2) {
      std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator*
                ((_Rb_tree_const_iterator<std::pair<int,_int>_> *)0x1b6825);
      std::tie<int,int>(&__in->first,(int *)in_RDI);
      std::tuple<int&,int&>::operator=
                ((tuple<int_&,_int_&> *)CONCAT17(bVar1,in_stack_ffffffffffffff70),__in);
      *(undefined1 *)((long)in_RDI + (long)local_78 + (long)local_74 * 9 + 8) = 0;
      std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator++(in_RDI);
    }
  }
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  ~set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
        *)0x1b68a5);
  return;
}

Assistant:

virtual void check_alive(int i, int j)
	{
		std::set<std::pair<int, int>> pieces;
		if (!is_alive(i, j, &pieces)) {
			// Remove the dead pieces.
			for (auto& ij: pieces) {
				int i, j;
				std::tie(i, j) = ij;
				board[i][j] = empty;
			}
		}
	}